

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

bool __thiscall
QMimeXMLProvider::load(QMimeXMLProvider *this,QString *fileName,QString *errorMessage)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  int __oflag;
  long in_FS_OFFSET;
  QString local_b8;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
  local_98;
  QString local_58;
  QFile local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_38,fileName);
  iVar5 = QFile::open(&local_38,(char *)0x11,__oflag);
  if ((char)iVar5 == '\0') {
    if (errorMessage != (QString *)0x0) {
      QIODevice::errorString(&local_b8,(QIODevice *)&local_38);
      local_98.b.d.size = local_b8.d.size;
      local_98.b.d.ptr = local_b8.d.ptr;
      local_98.b.d.d = local_b8.d.d;
      local_98.a.a.a.m_size = 0xc;
      local_98.a.a.a.m_data = "Cannot open ";
      local_98.a.b.m_size = 2;
      local_98.a.b.m_data = ": ";
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)0x0;
      local_b8.d.size = 0;
      local_98.a.a.b = fileName;
      QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_QString>
      ::convertTo<QString>(&local_58,&local_98);
      pQVar1 = &((errorMessage->d).d)->super_QArrayData;
      pcVar2 = (errorMessage->d).ptr;
      (errorMessage->d).d = local_58.d.d;
      (errorMessage->d).ptr = local_58.d.ptr;
      qVar3 = (errorMessage->d).size;
      (errorMessage->d).size = local_58.d.size;
      local_58.d.d = (Data *)pQVar1;
      local_58.d.ptr = pcVar2;
      local_58.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (&(local_98.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    bVar4 = false;
  }
  else {
    if ((errorMessage != (QString *)0x0) && ((errorMessage->d).ptr != (char16_t *)0x0)) {
      pQVar1 = &((errorMessage->d).d)->super_QArrayData;
      (errorMessage->d).d = (Data *)0x0;
      (errorMessage->d).ptr = (char16_t *)0x0;
      (errorMessage->d).size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    local_98.a.a.a.m_size = (qsizetype)&PTR__QMimeTypeParser_006a3378;
    local_98.a.a.a.m_data = (char *)this;
    bVar4 = QMimeTypeParserBase::parse
                      ((QMimeTypeParserBase *)&local_98,(QIODevice *)&local_38,fileName,errorMessage
                      );
    QMimeTypeParser::~QMimeTypeParser((QMimeTypeParser *)&local_98);
  }
  QFile::~QFile(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMimeXMLProvider::load(const QString &fileName, QString *errorMessage)
{
    QFile file(fileName);
    if (!file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        if (errorMessage)
            *errorMessage = "Cannot open "_L1 + fileName + ": "_L1 + file.errorString();
        return false;
    }

    if (errorMessage)
        errorMessage->clear();

    QMimeTypeParser parser(*this);
    return parser.parse(&file, fileName, errorMessage);
}